

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O0

JsErrorCode JsTTDDiagWriteLog(char *uri,size_t uriLength)

{
  anon_class_16_2_85bee0af fn;
  JsErrorCode JVar1;
  size_t local_18;
  size_t uriLength_local;
  char *uri_local;
  
  fn.uriLength = &local_18;
  fn.uri = (char **)&uriLength_local;
  local_18 = uriLength;
  uriLength_local = (size_t)uri;
  JVar1 = ContextAPIWrapper_NoRecord<true,JsTTDDiagWriteLog::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsTTDDiagWriteLog(_In_reads_(uriLength) const char* uri, _In_ size_t uriLength)
{
#if !ENABLE_TTD
    return JsErrorCategoryUsage;
#else
    return ContextAPIWrapper_NoRecord<true>([&](Js::ScriptContext * scriptContext) -> JsErrorCode {
        if (!scriptContext->GetThreadContext()->IsRuntimeInTTDMode() || !scriptContext->GetThreadContext()->TTDLog->CanWriteInnerLoopTrace())
        {
            return JsErrorDiagUnableToPerformAction;
        }

        JsrtContext *currentContext = JsrtContext::GetCurrent();
        JsrtRuntime* runtime = currentContext->GetRuntime();

        VALIDATE_RUNTIME_IS_AT_BREAK(runtime);

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        TTD::TTDebuggerSourceLocation cloc;
        jsrtDebugManager->GetThreadContext()->TTDExecutionInfo->GetTimeAndPositionForDebugger(cloc);
        jsrtDebugManager->GetThreadContext()->TTDLog->InnerLoopEmitLog(cloc, uri, uriLength);

        return JsNoError;
    });
#endif
}